

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O1

void __thiscall LLVMBC::StreamState::append(StreamState *this,NamedMDNode *md)

{
  uint uVar1;
  uint uVar2;
  String *ts;
  MDNode *md_00;
  
  ts = NamedMDNode::getName_abi_cxx11_(md);
  append<char_const(&)[2],std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&,char_const(&)[6]>
            (this,(char (*) [2])0x1c995d,ts,(char (*) [6])" = !{");
  uVar1 = NamedMDNode::getNumOperands(md);
  if (uVar1 != 0) {
    uVar1 = 0;
    do {
      md_00 = NamedMDNode::getOperand(md,uVar1);
      append(this,md_00,false);
      uVar1 = uVar1 + 1;
      uVar2 = NamedMDNode::getNumOperands(md);
      if (uVar1 < uVar2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
      }
      uVar2 = NamedMDNode::getNumOperands(md);
    } while (uVar1 < uVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"}",1);
  return;
}

Assistant:

void StreamState::append(NamedMDNode *md)
{
	append("!", md->getName(), " = !{");
	for (unsigned i = 0; i < md->getNumOperands(); i++)
	{
		append(md->getOperand(i), false);
		if (i + 1 < md->getNumOperands())
			append(", ");
	}

	append("}");
}